

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_cookie_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  bool bVar1;
  int iVar2;
  uchar *data;
  size_t len;
  undefined1 local_90 [8];
  CBB cookie;
  CBB contents;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  bVar1 = Array<unsigned_char>::empty(&hs->cookie);
  if (bVar1) {
    hs_local._7_1_ = true;
  }
  else {
    iVar2 = CBB_add_u16(out_compressible,0x2c);
    if (((iVar2 != 0) &&
        (iVar2 = CBB_add_u16_length_prefixed(out_compressible,(CBB *)((long)&cookie.u + 0x18)),
        iVar2 != 0)) &&
       (iVar2 = CBB_add_u16_length_prefixed((CBB *)((long)&cookie.u + 0x18),(CBB *)local_90),
       iVar2 != 0)) {
      data = Array<unsigned_char>::data(&hs->cookie);
      len = Array<unsigned_char>::size(&hs->cookie);
      iVar2 = CBB_add_bytes((CBB *)local_90,data,len);
      if ((iVar2 != 0) && (iVar2 = CBB_flush(out_compressible), iVar2 != 0)) {
        return true;
      }
    }
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_cookie_add_clienthello(const SSL_HANDSHAKE *hs, CBB *out,
                                       CBB *out_compressible,
                                       ssl_client_hello_type_t type) {
  if (hs->cookie.empty()) {
    return true;
  }

  CBB contents, cookie;
  if (!CBB_add_u16(out_compressible, TLSEXT_TYPE_cookie) ||
      !CBB_add_u16_length_prefixed(out_compressible, &contents) ||
      !CBB_add_u16_length_prefixed(&contents, &cookie) ||
      !CBB_add_bytes(&cookie, hs->cookie.data(), hs->cookie.size()) ||
      !CBB_flush(out_compressible)) {
    return false;
  }

  return true;
}